

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

int SUNMemoryHelper_Alloc
              (SUNMemoryHelper helper,SUNMemory *memptr,size_t memsize,SUNMemoryType mem_type,
              void *queue)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int ier;
  undefined4 local_2c;
  
  if (**(long **)(in_RDI + 8) == 0) {
    local_2c = -1;
  }
  else {
    local_2c = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  }
  return local_2c;
}

Assistant:

int SUNMemoryHelper_Alloc(SUNMemoryHelper helper, SUNMemory* memptr,
                          size_t memsize, SUNMemoryType mem_type, void* queue)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  if (helper->ops->alloc == NULL)
    ier = -1;
  else
    ier = helper->ops->alloc(helper, memptr, memsize, mem_type, queue);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return(ier);
}